

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O2

void __thiscall ScriptException::Free(ScriptException *this)

{
  this->ichMin = 0;
  this->ichLim = 0;
  FreeExcepInfo(&this->ei);
  return;
}

Assistant:

void ScriptException::Free(void)
{
    ichMin = ichLim = 0;
    FreeExcepInfo(&ei);
}